

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemanager.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall FileManager::get_dir(FileManager *this,string *curr_path)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  DIR *__dirp;
  allocator<char> local_51;
  undefined1 local_50 [8];
  string dat;
  dirent *entry;
  DIR *dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *directory;
  string *curr_path_local;
  FileManager *this_local;
  
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)operator_new(0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this_00);
  pcVar1 = (char *)std::__cxx11::string::data();
  __dirp = opendir(pcVar1);
  dat.field_2._8_8_ = readdir(__dirp);
  while (dat.field_2._8_8_ != 0) {
    pcVar1 = (char *)(dat.field_2._8_8_ + 0x13);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,pcVar1,&local_51);
    std::allocator<char>::~allocator(&local_51);
    std::__cxx11::string::operator+=((string *)local_50,"|");
    pcVar1 = dirent_type_to_str(*(uchar *)(dat.field_2._8_8_ + 0x12));
    std::__cxx11::string::operator+=((string *)local_50,pcVar1);
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_50);
    if (*pcVar1 != '.') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,(value_type *)local_50);
    }
    dat.field_2._8_8_ = readdir(__dirp);
    std::__cxx11::string::~string((string *)local_50);
  }
  closedir(__dirp);
  return this_00;
}

Assistant:

std::vector<std::string>* FileManager::get_dir(std::string curr_path) {
    auto directory = new std::vector<std::string>;
    auto dir = opendir(curr_path.data());
    dirent* entry = readdir(dir);
    while (entry != nullptr) {
        std::string dat = entry->d_name;
        dat += "|";
        dat += dirent_type_to_str(entry->d_type);
        if (dat[0] != '.') directory->push_back(dat);
        entry = readdir(dir);
    }
    closedir(dir);
    return directory;
}